

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::SerializeWithCachedSizes
          (NonMaximumSuppressionLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  fVar1 = this->iouthreshold_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar1,output);
  }
  fVar1 = this->scorethreshold_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  }
  if (this->maxboxes_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,this->maxboxes_,output);
  }
  if (this->perclasssuppression_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(4,true,output);
    return;
  }
  return;
}

Assistant:

void NonMaximumSuppressionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NonMaximumSuppressionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float iouThreshold = 1;
  if (this->iouthreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->iouthreshold(), output);
  }

  // float scoreThreshold = 2;
  if (this->scorethreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->scorethreshold(), output);
  }

  // uint64 maxBoxes = 3;
  if (this->maxboxes() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->maxboxes(), output);
  }

  // bool perClassSuppression = 4;
  if (this->perclasssuppression() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(4, this->perclasssuppression(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NonMaximumSuppressionLayerParams)
}